

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ir.cc
# Opt level: O3

void __thiscall ir_visit_var_Test::~ir_visit_var_Test(ir_visit_var_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ir, visit_var) {  // NOLINT
    Context c;
    auto &mod = c.generator("test");
    auto &var1 = mod.var("a", 2);
    auto &var2 = mod.var("b", 2);

    auto expr = var1.assign(var2);

    VarVisitor visitor;
    visitor.visit_root(expr->ast_node());
    EXPECT_EQ(visitor.vars.size(), 2);
    EXPECT_EQ(visitor.vars[0], &var1);
    EXPECT_EQ(visitor.vars[1], &var2);
}